

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleLeggedOdometry.cpp
# Opt level: O3

void __thiscall iDynTree::SimpleLeggedOdometry::SimpleLeggedOdometry(SimpleLeggedOdometry *this)

{
  iDynTree::Model::Model(&this->m_model);
  iDynTree::Traversal::Traversal(&this->m_traversal);
  this->m_isModelValid = false;
  this->m_kinematicsUpdated = false;
  this->m_isOdometryInitialized = false;
  this->m_fixedLinkIndex = LINK_INVALID_INDEX;
  iDynTree::LinkPositions::LinkPositions(&this->m_base_H_link,0);
  iDynTree::Transform::Identity();
  return;
}

Assistant:

SimpleLeggedOdometry::SimpleLeggedOdometry(): m_model(),
                                              m_traversal(),
                                              m_isModelValid(false),
                                              m_kinematicsUpdated(false),
                                              m_isOdometryInitialized(false),
                                              m_fixedLinkIndex(iDynTree::LINK_INVALID_INDEX),
                                              m_world_H_fixedLink(Transform::Identity())
{
}